

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# braille.hpp
# Opt level: O2

void __thiscall plot::detail::braille::image_t::paint(image_t *this,image_t *other,TerminalOp op)

{
  pointer pbVar1;
  pointer dst;
  pointer this_00;
  block_t local_3c;
  
  dst = (this->
        super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
        ).
        super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
        ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (other->
           super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
           ).
           super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (other->
                 super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                 ).
                 super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pbVar1; this_00 = this_00 + 1
      ) {
    block_t::paint(&local_3c,this_00,dst,op);
    dst->pixels = local_3c.pixels;
    (dst->color).r = local_3c.color.r;
    (dst->color).g = local_3c.color.g;
    (dst->color).b = local_3c.color.b;
    (dst->color).a = local_3c.color.a;
    dst = dst + 1;
  }
  return;
}

Assistant:

void paint(image_t const& other, TerminalOp op) {
            auto dst = begin();
            for (auto src = other.begin(), src_end = other.end(); src != src_end; ++src, ++dst)
                *dst = src->paint(*dst, op);
        }